

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_schema.c
# Opt level: O0

int cfg_schema_handle_db_startup_changes(cfg_db *post_db)

{
  cfg_db *pre_change;
  int result;
  cfg_db *pre_db;
  cfg_db *post_db_local;
  
  pre_change = cfg_db_add();
  if (pre_change == (cfg_db *)0x0) {
    post_db_local._4_4_ = -1;
  }
  else {
    pre_change->schema = post_db->schema;
    post_db_local._4_4_ = _handle_db_changes(pre_change,post_db,true);
    cfg_db_remove(pre_change);
  }
  return post_db_local._4_4_;
}

Assistant:

int
cfg_schema_handle_db_startup_changes(struct cfg_db *post_db) {
  struct cfg_db *pre_db;
  int result;

  pre_db = cfg_db_add();
  if (pre_db == NULL) {
    return -1;
  }
  cfg_db_link_schema(pre_db, post_db->schema);

  result = _handle_db_changes(pre_db, post_db, true);
  cfg_db_remove(pre_db);
  return result;
}